

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnJson(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  undefined1 local_a8 [8];
  JsonString s;
  sqlite3_value **aReplace_local;
  sqlite3_context *pCtx_local;
  JsonNode *pNode_local;
  
  s._128_8_ = aReplace;
  jsonInit((JsonString *)local_a8,pCtx);
  jsonRenderNode(pNode,(JsonString *)local_a8,(sqlite3_value **)s._128_8_);
  jsonResult((JsonString *)local_a8);
  sqlite3_result_subtype(pCtx,0x4a);
  return;
}

Assistant:

static void jsonReturnJson(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  JsonString s;
  jsonInit(&s, pCtx);
  jsonRenderNode(pNode, &s, aReplace);
  jsonResult(&s);
  sqlite3_result_subtype(pCtx, JSON_SUBTYPE);
}